

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListFileCache.cxx
# Opt level: O1

cmCommandName * __thiscall
cmCommandContext::cmCommandName::operator=(cmCommandName *this,string *name)

{
  string local_38;
  
  std::__cxx11::string::_M_assign((string *)&this->Original);
  cmsys::SystemTools::LowerCase(&local_38,name);
  std::__cxx11::string::operator=((string *)this,(string *)&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return this;
}

Assistant:

cmCommandContext::cmCommandName& cmCommandContext::cmCommandName::operator=(
  std::string const& name)
{
  this->Original = name;
  this->Lower = cmSystemTools::LowerCase(name);
  return *this;
}